

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O1

upb_StringView jsondec_string(jsondec *d)

{
  byte *pbVar1;
  byte bVar2;
  uint32_t cp;
  uint32_t uVar3;
  int iVar4;
  char *pcVar5;
  size_t unaff_R13;
  char *unaff_R15;
  upb_StringView uVar6;
  char *end;
  char *buf_end;
  char *buf;
  byte *local_48;
  byte *local_40;
  char *local_38;
  
  local_38 = (char *)0x0;
  local_48 = (byte *)0x0;
  local_40 = (byte *)0x0;
  jsondec_skipws(d);
  pcVar5 = d->ptr;
  d->ptr = pcVar5 + 1;
  if (*pcVar5 == '\"') {
    do {
      pbVar1 = (byte *)d->ptr;
      if (d->end <= pbVar1) goto LAB_002feb4a;
      d->ptr = (char *)(pbVar1 + 1);
      bVar2 = *pbVar1;
      if (local_48 == local_40) {
        jsondec_resize(d,&local_38,(char **)&local_48,(char **)&local_40);
      }
      if (bVar2 == 0x5c) {
        pbVar1 = (byte *)d->ptr;
        if (pbVar1 == (byte *)d->end) {
          iVar4 = 5;
        }
        else {
          bVar2 = *pbVar1;
          d->ptr = (char *)(pbVar1 + 1);
          if (bVar2 != 0x75) {
            bVar2 = *pbVar1;
            if (bVar2 < 0x66) {
              if ((0x3a < bVar2 - 0x22) ||
                 ((0x400000000002001U >> ((ulong)(bVar2 - 0x22) & 0x3f) & 1) == 0)) {
                if (bVar2 != 0x62) goto LAB_002feb86;
                bVar2 = 8;
              }
            }
            else if (bVar2 < 0x72) {
              if (bVar2 == 0x66) {
                bVar2 = 0xc;
              }
              else {
                if (bVar2 != 0x6e) {
LAB_002feb86:
                  pcVar5 = "Invalid escape char";
                  goto LAB_002feb51;
                }
                bVar2 = 10;
              }
            }
            else if (bVar2 == 0x72) {
              bVar2 = 0xd;
            }
            else {
              if (bVar2 != 0x74) goto LAB_002feb86;
              bVar2 = 9;
            }
            *local_48 = bVar2;
            goto LAB_002feb26;
          }
          if ((long)local_40 - (long)local_48 < 4) {
            jsondec_resize(d,&local_38,(char **)&local_48,(char **)&local_40);
          }
          pbVar1 = local_48;
          cp = jsondec_codepoint(d);
          if ((cp & 0xfffffc00) == 0xd800) {
            jsondec_parselit(d,"\\u");
            uVar3 = jsondec_codepoint(d);
            if ((uVar3 & 0xfffffc00) != 0xdc00) {
              pcVar5 = "Invalid low surrogate";
              goto LAB_002feb51;
            }
            cp = (cp & 0x3ff) * 0x400 + (uVar3 & 0x3ff) + 0x10000;
          }
          else if ((cp & 0xfffffc00) == 0xdc00) {
            pcVar5 = "Unpaired low surrogate";
            goto LAB_002feb51;
          }
          iVar4 = upb_Unicode_ToUTF8(cp,(char *)pbVar1);
          if (iVar4 == 0) {
            pcVar5 = "Invalid codepoint";
            goto LAB_002feb51;
          }
          local_48 = pbVar1 + iVar4;
          iVar4 = 0;
        }
      }
      else if (bVar2 == 0x22) {
        *local_48 = 0;
        unaff_R13 = (long)local_48 - (long)local_38;
        iVar4 = 1;
        unaff_R15 = local_38;
      }
      else {
        if (bVar2 < 0x20) {
          pcVar5 = "Invalid char in JSON string";
          goto LAB_002feb51;
        }
        *local_48 = bVar2;
LAB_002feb26:
        local_48 = local_48 + 1;
        iVar4 = 0;
      }
    } while (iVar4 == 0);
    if (iVar4 != 5) {
      uVar6.size = unaff_R13;
      uVar6.data = unaff_R15;
      return uVar6;
    }
LAB_002feb4a:
    pcVar5 = "EOF inside string";
  }
  else {
    pcVar5 = "Expected string";
  }
LAB_002feb51:
  jsondec_err(d,pcVar5);
}

Assistant:

static upb_StringView jsondec_string(jsondec* d) {
  char* buf = NULL;
  char* end = NULL;
  char* buf_end = NULL;

  jsondec_skipws(d);

  if (*d->ptr++ != '"') {
    jsondec_err(d, "Expected string");
  }

  while (d->ptr < d->end) {
    char ch = *d->ptr++;

    if (end == buf_end) {
      jsondec_resize(d, &buf, &end, &buf_end);
    }

    switch (ch) {
      case '"': {
        upb_StringView ret;
        ret.data = buf;
        ret.size = end - buf;
        *end = '\0'; /* Needed for possible strtod(). */
        return ret;
      }
      case '\\':
        if (d->ptr == d->end) goto eof;
        if (*d->ptr == 'u') {
          d->ptr++;
          if (buf_end - end < 4) {
            /* Allow space for maximum-sized codepoint (4 bytes). */
            jsondec_resize(d, &buf, &end, &buf_end);
          }
          end += jsondec_unicode(d, end);
        } else {
          *end++ = jsondec_escape(d);
        }
        break;
      default:
        if ((unsigned char)ch < 0x20) {
          jsondec_err(d, "Invalid char in JSON string");
        }
        *end++ = ch;
        break;
    }
  }

eof:
  jsondec_err(d, "EOF inside string");
}